

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O3

mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
* __thiscall
ising::free_energy::square::
infinite<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
           *__return_storage_ptr__,square *this,
          mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
          *Jx,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *Jy,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *beta)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *pmVar6;
  bool bVar7;
  int iVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  invalid_argument *this_00;
  undefined1 *puVar10;
  false_type *pfVar11;
  tanh_sinh<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  integrator;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  undefined1 local_598 [12];
  uint uStack_58c;
  uint local_588;
  uint uStack_584;
  uint uStack_580;
  uint uStack_57c;
  uint local_578;
  uint uStack_574;
  int local_570;
  bool local_56c;
  undefined8 local_568;
  tanh_sinh<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  local_558;
  undefined1 local_548 [16];
  uint local_538 [2];
  uint auStack_530 [2];
  uint local_528 [2];
  int local_520;
  bool local_51c;
  undefined8 local_518;
  expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_508;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined4 local_4e0;
  undefined1 local_4dc;
  undefined8 local_4d8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *local_4d0;
  cpp_dec_float<50U,_int,_void> local_4c8;
  cpp_dec_float<50U,_int,_void> local_488;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_408;
  functor<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_3c8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_2d8;
  expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined4 local_270;
  undefined1 local_26c;
  undefined8 local_268;
  expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_258;
  cpp_dec_float<50U,_int,_void> local_248;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_208;
  cpp_dec_float<50U,_int,_void> local_1d0;
  cpp_dec_float<50U,_int,_void> local_198;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_160;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_e8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_a8;
  fvar_t local_68;
  
  puVar10 = &stack0xfffffffffffffa28;
  pfVar11 = (false_type *)Jy;
  bVar7 = operator<=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                      *)this,(int *)&stack0xfffffffffffffa28);
  if (!bVar7) {
    local_598._0_4_ = 0;
    bVar7 = operator<=(Jx,(int *)local_598);
    if (!bVar7) {
      bVar7 = operator<=(Jy,(int *)&stack0xfffffffffffffa28);
      if (!bVar7) {
        local_4d0 = __return_storage_ptr__;
        if (boost::math::constants::detail::
            constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            ::get_from_string()::result == '\0') {
          iVar8 = __cxa_guard_acquire(&boost::math::constants::detail::
                                       constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                                       ::get_from_string()::result);
          if (iVar8 != 0) {
            boost::math::tools::
            convert_from_string<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                      ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                        *)&boost::math::constants::detail::
                           constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                           ::get_from_string()::result,
                       (tools *)
                       "3.14159265358979323846264338327950288419716939937510582097494459230781640628620899862803482534211706798214808651e+00"
                       ,&stack0xfffffffffffffa28,pfVar11);
            __cxa_guard_release(&boost::math::constants::detail::
                                 constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                                 ::get_from_string()::result);
          }
        }
        local_318.base.m_backend.data._M_elems[8] = _DAT_00195d58;
        local_318.base.m_backend.data._M_elems[9] = (uint)DAT_00195d5c;
        local_318.base.m_backend.data._M_elems[4] = _DAT_00195d48;
        local_318.base.m_backend.data._M_elems[5] = _DAT_00195d4c;
        local_318.base.m_backend.data._M_elems[6] = (uint)uRam0000000000195d50;
        local_318.base.m_backend.data._M_elems[7] = uRam0000000000195d50._4_4_;
        local_318.base.m_backend.data._M_elems[0] =
             boost::math::constants::detail::
             constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
             ::get_from_string()::result;
        local_318.base.m_backend.data._M_elems[1] =
             boost::math::constants::detail::
             constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
             ::get_from_string()::result_4;
        local_318.base.m_backend.data._M_elems[2] = (uint)uRam0000000000195d40;
        local_318.base.m_backend.data._M_elems[3] = uRam0000000000195d40._4_4_;
        local_318.base.m_backend.exp = DAT_00195d5c._4_4_;
        local_318.base.m_backend.neg = (bool)DAT_00195d64;
        local_318.base.m_backend.fpclass = (fpclass_type)DAT_00195d68;
        local_318.base.m_backend.prec_elem = DAT_00195d68._4_4_;
        pcVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::min();
        local_548._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
        local_548._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
        local_538 = *(uint (*) [2])((pcVar9->data)._M_elems + 4);
        auStack_530 = *(uint (*) [2])((pcVar9->data)._M_elems + 6);
        local_488.data._M_elems._0_8_ = local_548;
        local_528 = *(uint (*) [2])((pcVar9->data)._M_elems + 8);
        local_520 = pcVar9->exp;
        local_51c = pcVar9->neg;
        local_518._0_4_ = pcVar9->fpclass;
        local_518._4_4_ = pcVar9->prec_elem;
        local_488.data._M_elems[2] = 4;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,int,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_int,_void,_void>
                    *)&local_488,(multiply_immediates *)local_598);
        uStack_580 = 0;
        uStack_57c = 0;
        local_578 = 0;
        uStack_574 = 0;
        local_570 = 0;
        local_56c = false;
        local_568._0_4_ = cpp_dec_float_finite;
        local_568._4_4_ = 10;
        local_558.m_imp.
        super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_598._0_4_ = uVar12;
        local_598._4_4_ = uVar13;
        local_598._8_4_ = uVar14;
        uStack_58c = uVar15;
        local_588 = uVar16;
        uStack_584 = uVar17;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>,std::allocator<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>>,unsigned_long&,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>const&>
                  (&local_558.m_imp.
                    super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   (tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                    **)&local_558,
                   (allocator<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>_>
                    *)&local_488,(unsigned_long *)&stack0xfffffffffffffa28,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)local_598);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_198,2,(type *)0x0);
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        boost::multiprecision::default_ops::
        eval_log<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa28,&local_198);
        local_a8.base.m_backend.data._M_elems[8] = 0;
        local_a8.base.m_backend.data._M_elems[9] = 0;
        local_a8.base.m_backend.data._M_elems[1] = uVar13;
        local_a8.base.m_backend.data._M_elems[0] = uVar12;
        local_a8.base.m_backend.data._M_elems[3] = uVar15;
        local_a8.base.m_backend.data._M_elems[2] = uVar14;
        local_a8.base.m_backend.data._M_elems[5] = uVar17;
        local_a8.base.m_backend.data._M_elems[4] = uVar16;
        local_a8.base.m_backend.data._M_elems[6] = 0;
        local_a8.base.m_backend.data._M_elems[7] = 0;
        local_a8.base.m_backend.exp = 0;
        local_a8.base.m_backend.neg = false;
        local_a8.base.m_backend.fpclass = cpp_dec_float_finite;
        local_a8.base.m_backend.prec_elem = 10;
        operator/(&local_160,&local_a8,2);
        local_408.m_backend.data._M_elems._32_8_ = *(undefined8 *)(this + 0x20);
        local_408.m_backend.data._M_elems._0_8_ = *(undefined8 *)this;
        local_408.m_backend.data._M_elems._8_8_ = *(undefined8 *)(this + 8);
        local_408.m_backend.data._M_elems._16_8_ = *(undefined8 *)(this + 0x10);
        local_408.m_backend.data._M_elems._24_8_ = *(undefined8 *)(this + 0x18);
        local_408.m_backend.exp = *(int *)(this + 0x28);
        local_408.m_backend.neg = *(bool *)(this + 0x2c);
        pfVar11 = (false_type *)CONCAT71((int7)((ulong)puVar10 >> 8),local_408.m_backend.neg);
        local_408.m_backend._48_8_ = *(undefined8 *)(this + 0x30);
        local_448.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((Jx->base).m_backend.data._M_elems + 8);
        local_448.m_backend.data._M_elems._0_8_ = *(undefined8 *)(Jx->base).m_backend.data._M_elems;
        local_448.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((Jx->base).m_backend.data._M_elems + 2);
        local_448.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((Jx->base).m_backend.data._M_elems + 4);
        local_448.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((Jx->base).m_backend.data._M_elems + 6);
        local_448.m_backend.exp = (Jx->base).m_backend.exp;
        local_448.m_backend.neg = (Jx->base).m_backend.neg;
        local_448.m_backend.fpclass = (Jx->base).m_backend.fpclass;
        local_448.m_backend.prec_elem = (Jx->base).m_backend.prec_elem;
        local_2d8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((Jy->base).m_backend.data._M_elems + 8);
        local_2d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(Jy->base).m_backend.data._M_elems;
        local_2d8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((Jy->base).m_backend.data._M_elems + 2);
        local_2d8.m_backend.data._M_elems[4] = (Jy->base).m_backend.data._M_elems[4];
        local_2d8.m_backend.data._M_elems[5] = (Jy->base).m_backend.data._M_elems[5];
        local_2d8.m_backend.data._M_elems[6] = (Jy->base).m_backend.data._M_elems[6];
        local_2d8.m_backend.data._M_elems[7] = (Jy->base).m_backend.data._M_elems[7];
        local_2d8.m_backend.exp = (Jy->base).m_backend.exp;
        local_2d8.m_backend.neg = (Jy->base).m_backend.neg;
        local_2d8.m_backend.fpclass = (Jy->base).m_backend.fpclass;
        local_2d8.m_backend.prec_elem = (Jy->base).m_backend.prec_elem;
        local_3c8.c_.base.m_backend.fpclass = cpp_dec_float_finite;
        local_3c8.c_.base.m_backend.prec_elem = 10;
        local_3c8.c_.base.m_backend.data._M_elems[0] = 0;
        local_3c8.c_.base.m_backend.data._M_elems[1] = 0;
        local_3c8.c_.base.m_backend.data._M_elems[2] = 0;
        local_3c8.c_.base.m_backend.data._M_elems[3] = 0;
        local_3c8.c_.base.m_backend.data._M_elems[4] = 0;
        local_3c8.c_.base.m_backend.data._M_elems[5] = 0;
        local_3c8.c_.base.m_backend.data._M_elems._24_5_ = 0;
        local_3c8.c_.base.m_backend.data._M_elems[7]._1_3_ = 0;
        local_3c8.c_.base.m_backend.data._M_elems._32_5_ = 0;
        local_3c8.c_.base.m_backend.data._M_elems[9]._1_3_ = 0;
        local_3c8.c_.base.m_backend.exp = 0;
        local_3c8.c_.base.m_backend.neg = false;
        local_3c8.chab_.base.m_backend.fpclass = cpp_dec_float_finite;
        local_3c8.chab_.base.m_backend.prec_elem = 10;
        local_3c8.chab_.base.m_backend.data._M_elems[0] = 0;
        local_3c8.chab_.base.m_backend.data._M_elems[1] = 0;
        local_3c8.chab_.base.m_backend.data._M_elems[2] = 0;
        local_3c8.chab_.base.m_backend.data._M_elems[3] = 0;
        local_3c8.chab_.base.m_backend.data._M_elems[4] = 0;
        local_3c8.chab_.base.m_backend.data._M_elems[5] = 0;
        local_3c8.chab_.base.m_backend.data._M_elems._24_5_ = 0;
        local_3c8.chab_.base.m_backend.data._M_elems[7]._1_3_ = 0;
        local_3c8.chab_.base.m_backend.data._M_elems._32_5_ = 0;
        local_3c8.chab_.base.m_backend.data._M_elems[9]._1_3_ = 0;
        local_3c8.chab_.base.m_backend.exp = 0;
        local_3c8.chab_.base.m_backend.neg = false;
        local_3c8.k_.base.m_backend.fpclass = cpp_dec_float_finite;
        local_3c8.k_.base.m_backend.prec_elem = 10;
        local_3c8.k_.base.m_backend.data._M_elems[0] = 0;
        local_3c8.k_.base.m_backend.data._M_elems[1] = 0;
        local_3c8.k_.base.m_backend.data._M_elems[2] = 0;
        local_3c8.k_.base.m_backend.data._M_elems[3] = 0;
        local_3c8.k_.base.m_backend.data._M_elems[4] = 0;
        local_3c8.k_.base.m_backend.data._M_elems[5] = 0;
        local_3c8.k_.base.m_backend.data._M_elems._24_5_ = 0;
        local_3c8.k_.base.m_backend.data._M_elems[7]._1_3_ = 0;
        local_3c8.k_.base.m_backend.data._M_elems._32_5_ = 0;
        local_3c8.k_.base.m_backend.data._M_elems[9]._1_3_ = 0;
        local_3c8.k_.base.m_backend.exp = 0;
        local_3c8.k_.base.m_backend.neg = false;
        if (boost::math::constants::detail::
            constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            ::get_from_string()::result == '\0') {
          iVar8 = __cxa_guard_acquire(&boost::math::constants::detail::
                                       constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                                       ::get_from_string()::result);
          if (iVar8 != 0) {
            boost::math::tools::
            convert_from_string<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                      ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                        *)&boost::math::constants::detail::
                           constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                           ::get_from_string()::result,
                       (tools *)
                       "3.14159265358979323846264338327950288419716939937510582097494459230781640628620899862803482534211706798214808651e+00"
                       ,&stack0xfffffffffffffa28,pfVar11);
            __cxa_guard_release(&boost::math::constants::detail::
                                 constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                                 ::get_from_string()::result);
          }
        }
        local_548._0_4_ = 2;
        local_548._8_8_ =
             &boost::math::constants::detail::
              constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
              ::get_from_string()::result;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_548,(multiply_immediates *)local_598);
        uStack_580 = 0;
        uStack_57c = 0;
        local_578 = 0;
        uStack_574 = 0;
        local_570 = 0;
        local_56c = false;
        local_568._0_4_ = cpp_dec_float_finite;
        local_568._4_4_ = 10;
        local_598._0_4_ = uVar12;
        local_598._4_4_ = uVar13;
        local_598._8_4_ = uVar14;
        uStack_58c = uVar15;
        local_588 = uVar16;
        uStack_584 = uVar17;
        operator/((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&stack0xfffffffffffffa28,1,
                  (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)local_598);
        local_3c8.c_.base.m_backend.data._M_elems._32_5_ = 0;
        local_3c8.c_.base.m_backend.data._M_elems[9]._1_3_ = 0;
        local_3c8.c_.base.m_backend.data._M_elems[1] = uVar13;
        local_3c8.c_.base.m_backend.data._M_elems[0] = uVar12;
        local_3c8.c_.base.m_backend.data._M_elems[3] = uVar15;
        local_3c8.c_.base.m_backend.data._M_elems[2] = uVar14;
        local_3c8.c_.base.m_backend.data._M_elems[5] = uVar17;
        local_3c8.c_.base.m_backend.data._M_elems[4] = uVar16;
        local_3c8.c_.base.m_backend.data._M_elems._24_5_ = 0;
        local_3c8.c_.base.m_backend.data._M_elems[7]._1_3_ = 0;
        local_3c8.c_.base.m_backend.exp = 0;
        local_3c8.c_.base.m_backend.neg = false;
        local_3c8.c_.base.m_backend.fpclass = cpp_dec_float_finite;
        local_3c8.c_.base.m_backend.prec_elem = 10;
        local_598._0_4_ = 2;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        unique0x10003c13 = (fvar_t *)&local_2d8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_598,(multiply_immediates *)local_548);
        local_488.data._M_elems[1] = uVar13;
        local_488.data._M_elems[0] = uVar12;
        local_488.data._M_elems[3] = uVar15;
        local_488.data._M_elems[2] = uVar14;
        local_488.data._M_elems[5] = uVar17;
        local_488.data._M_elems[4] = uVar16;
        local_488.data._M_elems[6] = 0;
        local_488.data._M_elems[7] = 0;
        local_488.data._M_elems[8] = 0;
        local_488.data._M_elems[9] = 0;
        local_488.exp = 0;
        local_488.neg = false;
        local_488.fpclass = cpp_dec_float_finite;
        local_488.prec_elem = 10;
        unique0x00005300 = (fvar_t *)&local_408;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        local_598._0_8_ =
             (allocator<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>_>
              *)&local_488;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_598,(multiply_immediates *)local_548);
        local_548._0_8_ = CONCAT44(uVar13,uVar12);
        local_548._8_8_ = CONCAT44(uVar15,uVar14);
        local_538[1] = uVar17;
        local_538[0] = uVar16;
        auStack_530[0] = 0;
        auStack_530[1] = 0;
        local_528[0] = 0;
        local_528[1] = 0;
        local_520 = 0;
        local_51c = false;
        local_518._0_4_ = cpp_dec_float_finite;
        local_518._4_4_ = 10;
        uVar12 = 0;
        uVar14 = 0;
        uVar16 = 0;
        uVar18 = 0;
        uVar20 = 0;
        uVar22 = 0;
        boost::multiprecision::default_ops::detail::
        sinhcosh<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_548,(cpp_dec_float<50U,_int,_void> *)0x0,
                   (cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa28);
        local_578 = 0;
        uStack_574 = 0;
        uStack_580 = 0;
        uStack_57c = 0;
        local_570 = 0;
        local_56c = false;
        local_568._0_4_ = cpp_dec_float_finite;
        local_568._4_4_ = 10;
        local_508.arg1 = (type)CONCAT44(local_508.arg1._4_4_,2);
        uVar13 = 0;
        uVar15 = 0;
        uVar17 = 0;
        uVar19 = 0;
        uVar21 = 0;
        uVar23 = 0;
        local_598._0_4_ = uVar12;
        local_598._4_4_ = uVar14;
        local_598._8_4_ = uVar16;
        uStack_58c = uVar18;
        local_588 = uVar20;
        uStack_584 = uVar22;
        local_508.arg2 = &local_2d8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_508,(multiply_immediates *)&local_4c8);
        local_248.data._M_elems[1] = uVar15;
        local_248.data._M_elems[0] = uVar13;
        local_248.data._M_elems[3] = uVar19;
        local_248.data._M_elems[2] = uVar17;
        local_248.data._M_elems[5] = uVar23;
        local_248.data._M_elems[4] = uVar21;
        local_248.data._M_elems[6] = 0;
        local_248.data._M_elems[7] = 0;
        local_508.arg1 = (type)&local_248;
        local_248.data._M_elems[8] = 0;
        local_248.data._M_elems[9] = 0;
        local_248.exp = 0;
        local_248.neg = false;
        local_248.fpclass = cpp_dec_float_finite;
        local_248.prec_elem = 10;
        local_508.arg2 = &local_448;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,&local_508,(multiply_immediates *)&local_4c8);
        local_4c8.data._M_elems[1] = uVar13;
        local_4c8.data._M_elems[0] = uVar12;
        local_4c8.data._M_elems[3] = uVar15;
        local_4c8.data._M_elems[2] = uVar14;
        local_4c8.data._M_elems[5] = uVar17;
        local_4c8.data._M_elems[4] = uVar16;
        local_4c8.data._M_elems[6] = 0;
        local_4c8.data._M_elems[7] = 0;
        local_4c8.data._M_elems[8] = 0;
        local_4c8.data._M_elems[9] = 0;
        local_4c8.exp = 0;
        local_4c8.neg = false;
        local_4c8.fpclass = cpp_dec_float_finite;
        local_4c8.prec_elem = 10;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        boost::multiprecision::default_ops::detail::
        sinhcosh<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_4c8,(cpp_dec_float<50U,_int,_void> *)0x0,
                   (cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa28);
        local_4e8 = 0;
        local_508.arg1 = (type)CONCAT44(uVar13,uVar12);
        local_508.arg2 = (type)CONCAT44(uVar15,uVar14);
        local_4f8 = CONCAT44(uVar17,uVar16);
        uStack_4f0 = 0;
        local_4e0 = 0;
        local_4dc = 0;
        local_4d8 = 0xa00000000;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        local_298.arg1 = (type)local_598;
        local_298.arg2 = (type)&local_508;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,&local_298,(multiply_immediates *)&local_258);
        local_3c8.chab_.base.m_backend.data._M_elems._32_5_ = 0;
        local_3c8.chab_.base.m_backend.data._M_elems[9]._1_3_ = 0;
        local_3c8.chab_.base.m_backend.data._M_elems[1] = uVar13;
        local_3c8.chab_.base.m_backend.data._M_elems[0] = uVar12;
        local_3c8.chab_.base.m_backend.data._M_elems[3] = uVar15;
        local_3c8.chab_.base.m_backend.data._M_elems[2] = uVar14;
        local_3c8.chab_.base.m_backend.data._M_elems[5] = uVar17;
        local_3c8.chab_.base.m_backend.data._M_elems[4] = uVar16;
        local_3c8.chab_.base.m_backend.data._M_elems._24_5_ = 0;
        local_3c8.chab_.base.m_backend.data._M_elems[7]._1_3_ = 0;
        local_3c8.chab_.base.m_backend.exp = 0;
        local_3c8.chab_.base.m_backend.neg = false;
        local_3c8.chab_.base.m_backend.fpclass = cpp_dec_float_finite;
        local_3c8.chab_.base.m_backend.prec_elem = 10;
        local_598._0_4_ = 2;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        unique0x10003c1b = (fvar_t *)&local_2d8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_598,(multiply_immediates *)local_548);
        local_508.arg1 = (type)CONCAT44(uVar13,uVar12);
        local_508.arg2 = (type)CONCAT44(uVar15,uVar14);
        local_4f8 = CONCAT44(uVar17,uVar16);
        uStack_4f0 = 0;
        local_4e8 = 0;
        local_4e0 = 0;
        local_4dc = 0;
        local_4d8 = 0xa00000000;
        unique0x00005300 = (fvar_t *)&local_408;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        local_598._0_8_ = &local_508;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_598,(multiply_immediates *)local_548);
        local_488.data._M_elems[1] = uVar13;
        local_488.data._M_elems[0] = uVar12;
        local_488.data._M_elems[3] = uVar15;
        local_488.data._M_elems[2] = uVar14;
        local_488.data._M_elems[5] = uVar17;
        local_488.data._M_elems[4] = uVar16;
        local_488.data._M_elems[6] = 0;
        local_488.data._M_elems[7] = 0;
        local_488.data._M_elems[8] = 0;
        local_488.data._M_elems[9] = 0;
        local_488.exp = 0;
        local_488.neg = false;
        local_488.fpclass = cpp_dec_float_finite;
        local_488.prec_elem = 10;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        boost::multiprecision::default_ops::detail::
        sinhcosh<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_488,(cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa28,
                   (cpp_dec_float<50U,_int,_void> *)0x0);
        local_528[0] = 0;
        local_528[1] = 0;
        local_548._0_8_ = CONCAT44(uVar13,uVar12);
        local_548._8_8_ = CONCAT44(uVar15,uVar14);
        local_538[1] = uVar17;
        local_538[0] = uVar16;
        auStack_530[0] = 0;
        auStack_530[1] = 0;
        local_520 = 0;
        local_51c = false;
        local_518._0_4_ = cpp_dec_float_finite;
        local_518._4_4_ = 10;
        local_598._0_4_ = 2;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        unique0x10003c23 = (fvar_t *)&local_2d8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_598,(multiply_immediates *)&local_4c8);
        local_298.arg1 = (type)CONCAT44(uVar13,uVar12);
        local_298.arg2 = (type)CONCAT44(uVar15,uVar14);
        local_288 = CONCAT44(uVar17,uVar16);
        uStack_280 = 0;
        local_278 = 0;
        local_270 = 0;
        local_26c = 0;
        local_268 = 0xa00000000;
        unique0x00005300 = (fvar_t *)&local_448;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        local_598._0_8_ = &local_298;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_598,(multiply_immediates *)&local_4c8);
        local_248.data._M_elems[1] = uVar13;
        local_248.data._M_elems[0] = uVar12;
        local_248.data._M_elems[3] = uVar15;
        local_248.data._M_elems[2] = uVar14;
        local_248.data._M_elems[5] = uVar17;
        local_248.data._M_elems[4] = uVar16;
        local_248.data._M_elems[6] = 0;
        local_248.data._M_elems[7] = 0;
        local_248.data._M_elems[8] = 0;
        local_248.data._M_elems[9] = 0;
        local_248.exp = 0;
        local_248.neg = false;
        local_248.fpclass = cpp_dec_float_finite;
        local_248.prec_elem = 10;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        boost::multiprecision::default_ops::detail::
        sinhcosh<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_248,(cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa28,
                   (cpp_dec_float<50U,_int,_void> *)0x0);
        local_4c8.data._M_elems[8] = 0;
        local_4c8.data._M_elems[9] = 0;
        local_4c8.data._M_elems[1] = uVar13;
        local_4c8.data._M_elems[0] = uVar12;
        local_4c8.data._M_elems[3] = uVar15;
        local_4c8.data._M_elems[2] = uVar14;
        local_4c8.data._M_elems[5] = uVar17;
        local_4c8.data._M_elems[4] = uVar16;
        local_4c8.data._M_elems[6] = 0;
        local_4c8.data._M_elems[7] = 0;
        local_4c8.exp = 0;
        local_4c8.neg = false;
        local_4c8.fpclass = cpp_dec_float_finite;
        local_4c8.prec_elem = 10;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        local_258.arg1 = (type)local_548;
        local_258.arg2 = (type)&local_4c8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,&local_258,(multiply_immediates *)local_598);
        uStack_580 = 0;
        uStack_57c = 0;
        local_578 = 0;
        uStack_574 = 0;
        local_570 = 0;
        local_56c = false;
        local_568._0_4_ = cpp_dec_float_finite;
        local_568._4_4_ = 10;
        local_598._0_4_ = uVar12;
        local_598._4_4_ = uVar13;
        local_598._8_4_ = uVar14;
        uStack_58c = uVar15;
        local_588 = uVar16;
        uStack_584 = uVar17;
        operator/((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&stack0xfffffffffffffa28,1,
                  (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)local_598);
        local_3c8.k_.base.m_backend.data._M_elems._32_5_ = 0;
        local_3c8.k_.base.m_backend.data._M_elems[9]._1_3_ = 0;
        local_3c8.k_.base.m_backend.data._M_elems[1] = uVar13;
        local_3c8.k_.base.m_backend.data._M_elems[0] = uVar12;
        local_3c8.k_.base.m_backend.data._M_elems[3] = uVar15;
        local_3c8.k_.base.m_backend.data._M_elems[2] = uVar14;
        local_3c8.k_.base.m_backend.data._M_elems[5] = uVar17;
        local_3c8.k_.base.m_backend.data._M_elems[4] = uVar16;
        local_3c8.k_.base.m_backend.data._M_elems._24_5_ = 0;
        local_3c8.k_.base.m_backend.data._M_elems[7]._1_3_ = 0;
        local_3c8.k_.base.m_backend.exp = 0;
        local_3c8.k_.base.m_backend.neg = false;
        local_3c8.k_.base.m_backend.fpclass = cpp_dec_float_finite;
        local_3c8.k_.base.m_backend.prec_elem = 10;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_1d0,0,(type *)0x0);
        operator/(&local_208,&local_318,2);
        pcVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::eps();
        uVar1 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
        local_578 = (uint)uVar1;
        uStack_574 = SUB84(uVar1,4);
        uVar2 = *(undefined8 *)(pcVar9->data)._M_elems;
        uVar3 = *(undefined8 *)((pcVar9->data)._M_elems + 2);
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 4);
        uVar5 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
        local_588 = (uint)uVar4;
        uStack_584 = (uint)((ulong)uVar4 >> 0x20);
        uStack_580 = (uint)uVar5;
        uStack_57c = SUB84(uVar5,4);
        local_598._0_4_ = (undefined4)uVar2;
        local_598._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
        local_598._8_4_ = (undefined4)uVar3;
        uStack_58c = (uint)((ulong)uVar3 >> 0x20);
        iVar8 = pcVar9->exp;
        bVar7 = pcVar9->neg;
        uVar2._0_4_ = pcVar9->fpclass;
        uVar2._4_4_ = pcVar9->prec_elem;
        uVar12 = local_598._0_4_;
        uVar13 = local_598._4_4_;
        uVar14 = local_598._8_4_;
        uVar15 = uStack_58c;
        uVar16 = local_588;
        uVar17 = uStack_584;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::calculate_sqrt
                  ((cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa28);
        local_128.base.m_backend.data._M_elems[1] = uVar13;
        local_128.base.m_backend.data._M_elems[0] = uVar12;
        local_128.base.m_backend.data._M_elems[3] = uVar15;
        local_128.base.m_backend.data._M_elems[2] = uVar14;
        local_128.base.m_backend.data._M_elems[5] = uVar17;
        local_128.base.m_backend.data._M_elems[4] = uVar16;
        local_128.base.m_backend.data._M_elems._24_8_ = uVar5;
        local_128.base.m_backend.data._M_elems._32_8_ = uVar1;
        local_128.base.m_backend.exp = iVar8;
        local_128.base.m_backend.neg = bVar7;
        local_128.base.m_backend._48_8_ = uVar2;
        boost::math::quadrature::
        tanh_sinh<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
        ::
        integrate<ising::free_energy::square::(anonymous_namespace)::functor<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                  (&local_68,&local_558,&local_3c8,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_1d0,&local_208,&local_128,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT44(uVar13,uVar12),
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT44(uVar15,uVar14),(size_t *)CONCAT44(uVar17,uVar16));
        local_598._0_4_ = 2;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        unique0x10003c0b = &local_68;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_598,(multiply_immediates *)local_548);
        local_e8.m_backend.data._M_elems[1] = uVar13;
        local_e8.m_backend.data._M_elems[0] = uVar12;
        local_e8.m_backend.data._M_elems[3] = uVar15;
        local_e8.m_backend.data._M_elems[2] = uVar14;
        local_e8.m_backend.data._M_elems[5] = uVar17;
        local_e8.m_backend.data._M_elems[4] = uVar16;
        local_e8.m_backend.data._M_elems[6] = 0;
        local_e8.m_backend.data._M_elems[7] = 0;
        local_548._8_8_ = &local_e8;
        local_e8.m_backend.data._M_elems[8] = 0;
        local_e8.m_backend.data._M_elems[9] = 0;
        local_e8.m_backend.exp = 0;
        local_e8.m_backend.neg = false;
        local_e8.m_backend.fpclass = cpp_dec_float_finite;
        local_e8.m_backend.prec_elem = 10;
        local_548._0_8_ = &local_160;
        uVar12 = 0;
        uVar14 = 0;
        uVar16 = 0;
        uVar18 = 0;
        uVar20 = 0;
        uVar22 = 0;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa28,
                   (expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_548,(add_immediates *)local_598);
        uStack_574 = 0;
        local_570 = 0;
        uStack_57c = 0;
        uStack_580 = 0;
        local_578 = 0;
        local_56c = uVar12 != 0;
        local_568._0_4_ = cpp_dec_float_finite;
        local_568._4_4_ = 10;
        uVar13 = 0;
        uVar15 = 0;
        uVar17 = 0;
        uVar19 = 0;
        uVar21 = 0;
        uVar23 = 0;
        local_598._0_4_ = uVar12;
        local_598._4_4_ = uVar14;
        local_598._8_4_ = uVar16;
        uStack_58c = uVar18;
        local_588 = uVar20;
        uStack_584 = uVar22;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa28,
                   (cpp_dec_float<50U,_int,_void> *)local_598,(cpp_dec_float<50U,_int,_void> *)Jy);
        pmVar6 = local_4d0;
        pcVar9 = &(local_4d0->base).m_backend;
        (pcVar9->data)._M_elems[8] = 0;
        (pcVar9->data)._M_elems[9] = 0;
        *(ulong *)((local_4d0->base).m_backend.data._M_elems + 4) = CONCAT44(uVar23,uVar21);
        pcVar9 = &(local_4d0->base).m_backend;
        (pcVar9->data)._M_elems[6] = 0;
        (pcVar9->data)._M_elems[7] = 0;
        *(ulong *)(local_4d0->base).m_backend.data._M_elems = CONCAT44(uVar15,uVar13);
        *(ulong *)((local_4d0->base).m_backend.data._M_elems + 2) = CONCAT44(uVar19,uVar17);
        (local_4d0->base).m_backend.exp = 0;
        (local_4d0->base).m_backend.neg = false;
        (local_4d0->base).m_backend.fpclass = cpp_dec_float_finite;
        (local_4d0->base).m_backend.prec_elem = 10;
        if (local_558.m_imp.
            super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_558.m_imp.
                     super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        return pmVar6;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"beta should be positive");
      goto LAB_00137024;
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Jx and Jy should be positive");
LAB_00137024:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline U infinite(T Jx, T Jy, U beta) {
  const unsigned long max_n = 1 << 16;
  typedef T real_t;
  if (Jx <= 0 || Jy <= 0)
    throw(std::invalid_argument("Jx and Jy should be positive"));
  if (beta <= 0)
    throw(std::invalid_argument("beta should be positive"));
  real_t pi = boost::math::constants::pi<real_t>();
  boost::math::quadrature::tanh_sinh<real_t> integrator;
  auto logZ = log(real_t(2)) / 2 +
              2 * integrator.integrate(func(Jx, Jy, beta), 0, pi / 2);
  return -logZ / beta;
}